

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O1

_Bool ptrlen_startswith(ptrlen whole,ptrlen prefix,ptrlen *tail)

{
  int iVar1;
  ulong __n;
  
  __n = prefix.len;
  if ((__n <= whole.len) && (iVar1 = bcmp(whole.ptr,prefix.ptr,__n), iVar1 == 0)) {
    if (tail == (ptrlen *)0x0) {
      return true;
    }
    tail->ptr = (void *)((long)whole.ptr + __n);
    tail->len = whole.len - __n;
    return true;
  }
  return false;
}

Assistant:

bool ptrlen_startswith(ptrlen whole, ptrlen prefix, ptrlen *tail)
{
    if (whole.len >= prefix.len &&
        !memcmp(whole.ptr, prefix.ptr, prefix.len)) {
        if (tail) {
            tail->ptr = (const char *)whole.ptr + prefix.len;
            tail->len = whole.len - prefix.len;
        }
        return true;
    }
    return false;
}